

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

printer * __thiscall
boost::ext::ut::v1_1_8::printer::operator<<
          (printer *this,
          eq_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_100UL,_0UL,_2UL,__1>_>
          *op)

{
  undefined1 *puVar1;
  size_t local_38;
  char *pcStack_30;
  size_t local_28;
  char *pcStack_20;
  
  puVar1 = &this->field_0x40;
  local_38 = (this->colors_).fail._M_len;
  pcStack_30 = (this->colors_).fail._M_str;
  local_28 = (this->colors_).pass._M_len;
  pcStack_20 = (this->colors_).pass._M_str;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(&pcStack_30)[(ulong)op->value_ * 2],
             (&local_38)[(ulong)op->value_ * 2]);
  std::ostream::_M_insert<double>(op->lhs_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," == ",4);
  std::ostream::_M_insert<double>(-100.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->colors_).none._M_str,(this->colors_).none._M_len);
  return this;
}

Assistant:

auto& operator<<(const detail::eq_<TLhs, TRhs>& op) {
      return (*this << color(op) << op.lhs() << " == " << op.rhs()
                    << colors_.none);
    }